

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PString::ReadValue(PString *this,FSerializer *ar,char *key,void *addr)

{
  char *local_38;
  char *cptr;
  void *addr_local;
  char *key_local;
  FSerializer *ar_local;
  PString *this_local;
  
  cptr = (char *)addr;
  addr_local = key;
  key_local = (char *)ar;
  ar_local = (FSerializer *)this;
  FSerializer::StringPtr(ar,key,&local_38);
  if (local_38 != (char *)0x0) {
    FString::operator=((FString *)cptr,local_38);
  }
  return local_38 != (char *)0x0;
}

Assistant:

bool PString::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	const char *cptr;
	ar.StringPtr(key, cptr);
	if (cptr == nullptr)
	{
		return false;
	}
	else
	{
		*(FString*)addr = cptr;
		return true;
	}
}